

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
::operator()(impl<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  PyTypeObject *pPVar1;
  _object *p_Var2;
  PyTypeObject *pPVar3;
  first_type p_Var4;
  HighFreqDataType HVar5;
  code *pcVar6;
  PyObject *pPVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  c_t2 c2;
  c_t1 c1;
  undefined8 in_stack_fffffffffffffe88;
  PyTypeObject *pPVar10;
  undefined1 *puVar11;
  undefined8 *in_stack_fffffffffffffea8;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 in_stack_fffffffffffffeb0 [88];
  HighFreqDataType local_b8;
  
  pPVar1 = args_[1].ob_type;
  p_Var2 = (_object *)args_[2].ob_refcnt;
  auVar8 = converter::rvalue_from_python_stage1
                     (p_Var2,converter::detail::registered_base<HighFreqDataType_const_volatile&>::
                             converters);
  if (auVar8._0_8_ == 0) {
    pPVar7 = (PyObject *)0x0;
  }
  else {
    pPVar3 = args_[2].ob_type;
    auVar9 = converter::rvalue_from_python_stage1
                       ((_object *)pPVar3,
                        converter::detail::registered_base<int_const_volatile&>::converters);
    puVar11 = auVar8._0_8_;
    pcVar6 = auVar9._8_8_;
    if (auVar9._0_8_ == 0) {
      pPVar7 = (PyObject *)0x0;
    }
    else {
      p_Var4 = (this->m_data).
               super_compressed_pair_imp<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_2>
               .first_;
      pPVar10 = pPVar3;
      if (auVar8._8_8_ != (code *)0x0) {
        (*auVar8._8_8_)(p_Var2);
      }
      HighFreqDataType::HighFreqDataType(&local_b8,auVar8._0_8_);
      if (pcVar6 != (code *)0x0) {
        (*pcVar6)(pPVar3,&stack0xfffffffffffffe78);
      }
      puVar11 = auVar8._0_8_;
      HVar5.name._M_string_length = in_stack_fffffffffffffe88;
      HVar5.super_NetworkDataType._vptr_NetworkDataType = (_func_int **)auVar9._0_8_;
      HVar5.name._M_dataplus._M_p = (pointer)auVar9._8_8_;
      HVar5.name.field_2._M_allocated_capacity = (size_type)pPVar10;
      HVar5.name.field_2._8_8_ = puVar11;
      HVar5.origin._M_dataplus._M_p = (pointer)auVar8._8_8_;
      HVar5.origin._M_string_length = (size_type)in_stack_fffffffffffffea8;
      auVar12 = in_stack_fffffffffffffeb0._16_32_;
      auVar13 = in_stack_fffffffffffffeb0._48_32_;
      HVar5.origin.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )in_stack_fffffffffffffeb0._0_16_;
      HVar5.dataFormat._M_dataplus._M_p = (pointer)auVar12._0_8_;
      HVar5.dataFormat._M_string_length = auVar12._8_8_;
      HVar5.dataFormat.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar12._16_16_;
      HVar5.sockAddr._M_dataplus._M_p = (pointer)auVar13._0_8_;
      HVar5.sockAddr._M_string_length = auVar13._8_8_;
      HVar5.sockAddr.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar13._16_16_;
      HVar5.byteSize = in_stack_fffffffffffffeb0._80_4_;
      HVar5._140_4_ = in_stack_fffffffffffffeb0._84_4_;
      (*p_Var4)((_object *)pPVar1,HVar5,(int)&local_b8);
      HighFreqDataType::~HighFreqDataType(&local_b8);
      pPVar7 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    if (puVar11 == &stack0xfffffffffffffea8) {
      (*(code *)*in_stack_fffffffffffffea8)();
    }
  }
  return pPVar7;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }